

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktRenderPassTests.cpp
# Opt level: O2

bool vkt::anon_unknown_0::logAndVerifyImages
               (TestLog *log,DeviceInterface *vk,VkDevice device,
               vector<de::SharedPtr<vkt::(anonymous_namespace)::AttachmentResources>,_std::allocator<de::SharedPtr<vkt::(anonymous_namespace)::AttachmentResources>_>_>
               *attachmentResources,vector<bool,_std::allocator<bool>_> *attachmentIsLazy,
               RenderPass *renderPassInfo,
               vector<tcu::Maybe<vk::VkClearValue>,_std::allocator<tcu::Maybe<vk::VkClearValue>_>_>
               *renderPassClearValues,
               vector<tcu::Maybe<vk::VkClearValue>,_std::allocator<tcu::Maybe<vk::VkClearValue>_>_>
               *imageClearValues,
               vector<vkt::(anonymous_namespace)::SubpassRenderInfo,_std::allocator<vkt::(anonymous_namespace)::SubpassRenderInfo>_>
               *subpassRenderInfo,UVec2 *targetSize,TestConfig *config)

{
  pointer __n;
  uint *this;
  ushort uVar1;
  VkAttachmentLoadOp VVar2;
  VkFormat format_00;
  allocator<vkt::(anonymous_namespace)::PixelValue> *paVar3;
  allocator<vkt::(anonymous_namespace)::PixelValue> *__first;
  _Vector_base<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
  *this_00;
  pointer pPVar4;
  long lVar5;
  DepthStencilClear *v;
  RenderQuad *pRVar6;
  deUint8 *pdVar7;
  void *pvVar8;
  void *data;
  byte bVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined4 uVar12;
  undefined4 uVar13;
  size_type sVar14;
  Vec2 VVar15;
  TextureFormat TVar16;
  VkClearValue VVar17;
  pointer pvVar18;
  bool bVar19;
  const_reference cVar20;
  PixelValue PVar21;
  undefined4 extraout_EAX;
  uint uVar22;
  int iVar23;
  uint uVar24;
  int iVar25;
  VkResult VVar26;
  int iVar27;
  vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
  *__cur;
  vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
  *pvVar28;
  TextureFormat TVar29;
  ulong uVar30;
  pointer pPVar31;
  uint auVar32 [2];
  uint auVar33 [2];
  pointer pAVar34;
  ulong uVar35;
  pointer pAVar36;
  ConstPixelBufferAccess *pCVar37;
  size_t __n_00;
  allocator<vkt::(anonymous_namespace)::PixelValue> *extraout_RDX;
  TextureLevel *pTVar38;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  void *__buf_03;
  void *__buf_04;
  void *__buf_05;
  void *__buf_06;
  void *__buf_07;
  void *__buf_08;
  void *__buf_09;
  void *__buf_10;
  void *__buf_11;
  void *__buf_12;
  DepthStencilClear *dsClear;
  ulong __n_01;
  RenderPass *pRVar39;
  PixelValue *pPVar40;
  size_t ndx;
  ushort uVar41;
  uint stencil;
  TextureFormat *color;
  int y;
  size_t colorClearNdx;
  pointer pSVar42;
  size_t sVar43;
  size_t attachmentNdx;
  int x_1;
  long lVar44;
  ulong uVar45;
  ulong uVar46;
  int x_5;
  pointer pSVar47;
  bool bVar48;
  bool bVar49;
  float fVar50;
  float fVar54;
  float fVar55;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  reference rVar61;
  size_type local_488;
  RenderPass *local_480;
  ulong local_478;
  vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
  *local_470;
  vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
  *local_468;
  TestLog *local_460;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_458;
  pointer local_438;
  ulong local_430;
  undefined8 local_428;
  UVec2 *local_420;
  UVec2 *local_418;
  size_t index;
  int local_408;
  int local_404;
  int local_400;
  int local_3fc;
  UVec2 offset;
  anon_union_8_2_d0736028_for_Maybe<bool>_2 local_3f0 [4];
  Vec2 p;
  Vec2 origin;
  TextureFormat format_7;
  string local_378;
  ulong local_358;
  ulong local_350;
  TextureFormat format_3;
  UVec2 size;
  TextureFormat format;
  TextureFormat TStack_2e0;
  vector<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>,_std::allocator<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>_>_>
  referenceValues;
  long local_280;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  vector<de::SharedPtr<vkt::(anonymous_namespace)::AttachmentResources>,_std::allocator<de::SharedPtr<vkt::(anonymous_namespace)::AttachmentResources>_>_>
  *local_258;
  uint local_24c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  vector<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_> referenceAttachments;
  vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
  *local_208;
  TextureFormat stencilFormat;
  TextureFormat depthFormat;
  string local_1d0;
  vector<bool,_std::allocator<bool>_> attachmentUsed;
  
  referenceValues.
  super__Vector_base<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>,_std::allocator<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  referenceAttachments.super__Vector_base<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  referenceValues.
  super__Vector_base<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>,_std::allocator<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  referenceValues.
  super__Vector_base<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>,_std::allocator<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  referenceAttachments.super__Vector_base<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  referenceAttachments.super__Vector_base<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this = &attachmentUsed.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
          ._M_start.super__Bit_iterator_base._M_offset;
  local_460 = log;
  local_258 = attachmentResources;
  attachmentUsed.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)this);
  std::operator<<((ostream *)this,"Reference images fill undefined pixels with 3x3 grid pattern.");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&attachmentUsed,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)this);
  auVar11[0xf] = 0;
  auVar11._0_15_ = stack0xfffffffffffffd19;
  _format = (VkClearValue)(auVar11 << 8);
  std::vector<bool,_std::allocator<bool>_>::vector
            (&attachmentUsed,
             (long)(renderPassInfo->m_attachments).
                   super__Vector_base<vkt::(anonymous_namespace)::Attachment,_std::allocator<vkt::(anonymous_namespace)::Attachment>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(renderPassInfo->m_attachments).
                   super__Vector_base<vkt::(anonymous_namespace)::Attachment,_std::allocator<vkt::(anonymous_namespace)::Attachment>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 5,(bool *)&format,
             (allocator_type *)&offset);
  lVar44 = (long)(renderPassInfo->m_attachments).
                 super__Vector_base<vkt::(anonymous_namespace)::Attachment,_std::allocator<vkt::(anonymous_namespace)::Attachment>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(renderPassInfo->m_attachments).
                 super__Vector_base<vkt::(anonymous_namespace)::Attachment,_std::allocator<vkt::(anonymous_namespace)::Attachment>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  local_480 = renderPassInfo;
  if (lVar44 == 0) {
    local_208 = (vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
                 *)0x0;
    local_468 = (vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
                 *)0x0;
  }
  else {
    uVar45 = lVar44 >> 5;
    if (0x555555555555555 < uVar45) {
      std::__throw_length_error("vector::_M_default_append");
    }
    local_468 = (vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
                 *)operator_new(uVar45 * 0x18);
    pvVar28 = local_468;
    uVar46 = uVar45;
    while (bVar48 = uVar46 != 0, uVar46 = uVar46 - 1, bVar48) {
      (pvVar28->
      super__Vector_base<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
      )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (pvVar28->
      super__Vector_base<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
      )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (pvVar28->
      super__Vector_base<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
      )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pvVar28 = pvVar28 + 1;
    }
    std::
    _Vector_base<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>,_std::allocator<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>_>_>
    ::_M_deallocate((_Vector_base<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>,_std::allocator<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>_>_>
                     *)0x0,(pointer)0x0,__n_00);
    referenceValues.
    super__Vector_base<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>,_std::allocator<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = local_468;
    referenceValues.
    super__Vector_base<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>,_std::allocator<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = local_468 + uVar45;
    referenceValues.
    super__Vector_base<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>,_std::allocator<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         referenceValues.
         super__Vector_base<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>,_std::allocator<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_208 = referenceValues.
                super__Vector_base<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>,_std::allocator<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
  }
  local_420 = &config->renderPos;
  local_418 = &config->renderSize;
  uVar45 = 0;
  pRVar39 = local_480;
  while (pAVar34 = (pRVar39->m_attachments).
                   super__Vector_base<vkt::(anonymous_namespace)::Attachment,_std::allocator<vkt::(anonymous_namespace)::Attachment>_>
                   ._M_impl.super__Vector_impl_data._M_start,
        uVar45 < (ulong)((long)(pRVar39->m_attachments).
                               super__Vector_base<vkt::(anonymous_namespace)::Attachment,_std::allocator<vkt::(anonymous_namespace)::Attachment>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)pAVar34 >> 5)) {
    TVar29 = ::vk::mapVkFormat(pAVar34[uVar45].m_format);
    format = TVar29;
    local_470 = local_468 + uVar45;
    uVar35 = (ulong)(targetSize->m_data[1] * targetSize->m_data[0]);
    paVar3 = (allocator<vkt::(anonymous_namespace)::PixelValue> *)
             local_468[uVar45].
             super__Vector_base<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
             ._M_impl.super__Vector_impl_data._M_start;
    __first = (allocator<vkt::(anonymous_namespace)::PixelValue> *)
              local_468[uVar45].
              super__Vector_base<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    uVar30 = (long)__first - (long)paVar3 >> 1;
    __n_01 = uVar35 - uVar30;
    uVar46 = uVar45;
    if (uVar35 < uVar30 || __n_01 == 0) {
      if ((uVar35 < uVar30) && (__first != paVar3 + uVar35 * 2)) {
        (local_470->
        super__Vector_base<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
        )._M_impl.super__Vector_impl_data._M_finish = (pointer)(paVar3 + uVar35 * 2);
      }
    }
    else if ((ulong)((long)(local_470->
                           super__Vector_base<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
                           )._M_impl.super__Vector_impl_data._M_end_of_storage - (long)__first >> 1)
             < __n_01) {
      local_478 = uVar45;
      if ((uVar30 ^ 0x3fffffffffffffff) < __n_01) {
        std::__throw_length_error("vector::_M_default_append");
      }
      uVar46 = __n_01;
      if (__n_01 < uVar30) {
        uVar46 = uVar30;
      }
      pPVar31 = (pointer)operator_new((uVar46 + uVar30) * 2);
      pPVar40 = (PixelValue *)(((long)__first - (long)paVar3) + (long)pPVar31);
      std::
      __uninitialized_default_n_a<vkt::(anonymous_namespace)::PixelValue*,unsigned_long,vkt::(anonymous_namespace)::PixelValue>
                (pPVar40,__n_01,extraout_RDX);
      this_00 = (_Vector_base<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
                 *)(local_470->
                   super__Vector_base<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
                   )._M_impl.super__Vector_impl_data._M_start;
      pPVar4 = (local_470->
               super__Vector_base<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      for (lVar44 = 0;
          __n = (pointer)((long)&(this_00->_M_impl).super__Vector_impl_data._M_start + lVar44),
          __n != pPVar4; lVar44 = lVar44 + 2) {
        *(deUint16 *)((long)&pPVar31->m_status + lVar44) = __n->m_status;
      }
      std::
      _Vector_base<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
      ::_M_deallocate(this_00,(pointer)((long)(local_470->
                                              super__Vector_base<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
                                              )._M_impl.super__Vector_impl_data._M_end_of_storage -
                                        (long)this_00 >> 1),(size_t)__n);
      (local_470->
      super__Vector_base<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
      )._M_impl.super__Vector_impl_data._M_start = pPVar31;
      (local_470->
      super__Vector_base<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
      )._M_impl.super__Vector_impl_data._M_finish = pPVar40 + __n_01;
      (local_470->
      super__Vector_base<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
      )._M_impl.super__Vector_impl_data._M_end_of_storage = pPVar31 + uVar46 + uVar30;
      uVar46 = local_478;
    }
    else {
      pPVar40 = std::
                __uninitialized_default_n_a<vkt::(anonymous_namespace)::PixelValue*,unsigned_long,vkt::(anonymous_namespace)::PixelValue>
                          ((PixelValue *)__first,__n_01,paVar3);
      (local_470->
      super__Vector_base<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
      )._M_impl.super__Vector_impl_data._M_finish = pPVar40;
    }
    pRVar39 = local_480;
    if ((imageClearValues->
        super__Vector_base<tcu::Maybe<vk::VkClearValue>,_std::allocator<tcu::Maybe<vk::VkClearValue>_>_>
        )._M_impl.super__Vector_impl_data._M_start[uVar45].m_ptr != (VkClearValue *)0x0) {
      offset.m_data[0] = 0;
      offset.m_data[1] = 0;
      tcu::Vector<bool,_4>::Vector((Vector<bool,_4> *)&size,true);
      PVar21 = clearValueToPixelValue
                         ((imageClearValues->
                          super__Vector_base<tcu::Maybe<vk::VkClearValue>,_std::allocator<tcu::Maybe<vk::VkClearValue>_>_>
                          )._M_impl.super__Vector_impl_data._M_start[uVar45].m_ptr,&format);
      format_3.order._0_2_ = PVar21.m_status;
      clearReferenceValues
                (local_470,targetSize,&offset,targetSize,(BVec4 *)&size,(PixelValue *)&format_3);
    }
    uVar45 = uVar46 + 1;
  }
  for (uVar45 = 0;
      pSVar42 = (pRVar39->m_subpasses).
                super__Vector_base<vkt::(anonymous_namespace)::Subpass,_std::allocator<vkt::(anonymous_namespace)::Subpass>_>
                ._M_impl.super__Vector_impl_data._M_start,
      uVar45 < (ulong)(((long)(pRVar39->m_subpasses).
                              super__Vector_base<vkt::(anonymous_namespace)::Subpass,_std::allocator<vkt::(anonymous_namespace)::Subpass>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar42) / 0x70);
      uVar45 = uVar45 + 1) {
    pSVar42 = pSVar42 + uVar45;
    pSVar47 = (subpassRenderInfo->
              super__Vector_base<vkt::(anonymous_namespace)::SubpassRenderInfo,_std::allocator<vkt::(anonymous_namespace)::SubpassRenderInfo>_>
              )._M_impl.super__Vector_impl_data._M_start + uVar45;
    local_470 = referenceValues.
                super__Vector_base<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>,_std::allocator<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
    uVar46 = 0;
    local_438 = pSVar42;
    index = uVar45;
    while( true ) {
      lVar44 = *(long *)&(pSVar42->m_colorAttachments).
                         super__Vector_base<vkt::(anonymous_namespace)::AttachmentReference,_std::allocator<vkt::(anonymous_namespace)::AttachmentReference>_>
                         ._M_impl.super__Vector_impl_data;
      if ((ulong)((long)(pSVar42->m_colorAttachments).
                        super__Vector_base<vkt::(anonymous_namespace)::AttachmentReference,_std::allocator<vkt::(anonymous_namespace)::AttachmentReference>_>
                        ._M_impl.super__Vector_impl_data._M_finish - lVar44 >> 3) <= uVar46) break;
      uVar45 = (ulong)*(uint *)(lVar44 + uVar46 * 8);
      rVar61 = std::vector<bool,_std::allocator<bool>_>::operator[](&attachmentUsed,uVar45);
      if ((*rVar61._M_p & rVar61._M_mask) == 0) {
        pAVar34 = (local_480->m_attachments).
                  super__Vector_base<vkt::(anonymous_namespace)::Attachment,_std::allocator<vkt::(anonymous_namespace)::Attachment>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        TVar29 = ::vk::mapVkFormat(pAVar34[uVar45].m_format);
        pvVar28 = local_470 + uVar45;
        format = TVar29;
        VVar2 = pAVar34[uVar45].m_loadOp;
        if (VVar2 == VK_ATTACHMENT_LOAD_OP_DONT_CARE) {
          tcu::Vector<bool,_4>::Vector((Vector<bool,_4> *)&offset,true);
          markUndefined(pvVar28,(BVec4 *)&offset,targetSize,local_420,local_418);
        }
        else if (VVar2 == VK_ATTACHMENT_LOAD_OP_CLEAR) {
          tcu::Vector<bool,_4>::Vector((Vector<bool,_4> *)&offset,true);
          size.m_data[0]._0_2_ =
               clearValueToPixelValue
                         ((renderPassClearValues->
                          super__Vector_base<tcu::Maybe<vk::VkClearValue>,_std::allocator<tcu::Maybe<vk::VkClearValue>_>_>
                          )._M_impl.super__Vector_impl_data._M_start[uVar45].m_ptr,&format);
          clearReferenceValues
                    (pvVar28,targetSize,local_420,local_418,(BVec4 *)&offset,(PixelValue *)&size);
        }
        rVar61 = std::vector<bool,_std::allocator<bool>_>::operator[](&attachmentUsed,uVar45);
        *rVar61._M_p = *rVar61._M_p | rVar61._M_mask;
        pSVar42 = local_438;
      }
      uVar46 = uVar46 + 1;
    }
    uVar45 = (ulong)(pSVar42->m_depthStencilAttachment).m_attachment;
    if ((uVar45 != 0xffffffff) &&
       (rVar61 = std::vector<bool,_std::allocator<bool>_>::operator[](&attachmentUsed,uVar45),
       (*rVar61._M_p & rVar61._M_mask) == 0)) {
      pAVar34 = (local_480->m_attachments).
                super__Vector_base<vkt::(anonymous_namespace)::Attachment,_std::allocator<vkt::(anonymous_namespace)::Attachment>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pvVar28 = referenceValues.
                super__Vector_base<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>,_std::allocator<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start + uVar45;
      TVar29 = ::vk::mapVkFormat(pAVar34[uVar45].m_format);
      format = TVar29;
      bVar48 = tcu::hasDepthComponent(TVar29.order);
      if (bVar48) {
        if (pAVar34[uVar45].m_loadOp == VK_ATTACHMENT_LOAD_OP_DONT_CARE) {
          offset.m_data[0] = 1;
          markUndefined(pvVar28,(BVec4 *)&offset,targetSize,local_420,local_418);
        }
        else if (pAVar34[uVar45].m_loadOp == VK_ATTACHMENT_LOAD_OP_CLEAR) {
          offset.m_data[0] = 1;
          size.m_data[0]._0_2_ =
               clearValueToPixelValue
                         ((renderPassClearValues->
                          super__Vector_base<tcu::Maybe<vk::VkClearValue>,_std::allocator<tcu::Maybe<vk::VkClearValue>_>_>
                          )._M_impl.super__Vector_impl_data._M_start[uVar45].m_ptr,&format);
          clearReferenceValues
                    (pvVar28,targetSize,local_420,local_418,(BVec4 *)&offset,(PixelValue *)&size);
        }
      }
      bVar48 = tcu::hasStencilComponent(format.order);
      if (bVar48) {
        if (pAVar34[uVar45].m_stencilLoadOp == VK_ATTACHMENT_LOAD_OP_DONT_CARE) {
          offset.m_data[0] = 0x100;
          markUndefined(pvVar28,(BVec4 *)&offset,targetSize,local_420,local_418);
        }
        else if (pAVar34[uVar45].m_stencilLoadOp == VK_ATTACHMENT_LOAD_OP_CLEAR) {
          offset.m_data[0] = 0x100;
          size.m_data[0]._0_2_ =
               clearValueToPixelValue
                         ((renderPassClearValues->
                          super__Vector_base<tcu::Maybe<vk::VkClearValue>,_std::allocator<tcu::Maybe<vk::VkClearValue>_>_>
                          )._M_impl.super__Vector_impl_data._M_start[uVar45].m_ptr,&format);
          clearReferenceValues
                    (pvVar28,targetSize,local_420,local_418,(BVec4 *)&offset,(PixelValue *)&size);
        }
      }
      rVar61 = std::vector<bool,_std::allocator<bool>_>::operator[](&attachmentUsed,uVar45);
      *rVar61._M_p = *rVar61._M_p | rVar61._M_mask;
    }
    lVar44 = 8;
    local_468 = referenceValues.
                super__Vector_base<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>,_std::allocator<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
    for (uVar45 = 0;
        lVar5 = *(long *)&(pSVar47->m_colorClears).
                          super__Vector_base<vkt::(anonymous_namespace)::ColorClear,_std::allocator<vkt::(anonymous_namespace)::ColorClear>_>
                          ._M_impl.super__Vector_impl_data,
        uVar45 < (ulong)((long)(pSVar47->m_colorClears).
                               super__Vector_base<vkt::(anonymous_namespace)::ColorClear,_std::allocator<vkt::(anonymous_namespace)::ColorClear>_>
                               ._M_impl.super__Vector_impl_data._M_finish - lVar5 >> 5);
        uVar45 = uVar45 + 1) {
      tcu::Vector<unsigned_int,_2>::Vector(&offset,(Vector<unsigned_int,_2> *)(lVar44 + lVar5 + -8))
      ;
      tcu::Vector<unsigned_int,_2>::Vector(&size,(Vector<unsigned_int,_2> *)(lVar44 + lVar5));
      uVar22 = *(uint *)(*(long *)&(local_438->m_colorAttachments).
                                   super__Vector_base<vkt::(anonymous_namespace)::AttachmentReference,_std::allocator<vkt::(anonymous_namespace)::AttachmentReference>_>
                                   ._M_impl.super__Vector_impl_data + uVar45 * 8);
      format_3 = ::vk::mapVkFormat((local_480->m_attachments).
                                   super__Vector_base<vkt::(anonymous_namespace)::Attachment,_std::allocator<vkt::(anonymous_namespace)::Attachment>_>
                                   ._M_impl.super__Vector_impl_data._M_start[uVar22].m_format);
      _format = *(VkClearValue *)(lVar5 + 8 + lVar44);
      tcu::Vector<bool,_4>::Vector((Vector<bool,_4> *)&origin,true);
      PVar21 = clearValueToPixelValue((VkClearValue *)&format,&format_3);
      p.m_data[0]._0_2_ = PVar21.m_status;
      clearReferenceValues
                (local_468 + uVar22,targetSize,&offset,&size,(BVec4 *)&origin,(PixelValue *)&p);
      lVar44 = lVar44 + 0x20;
    }
    v = (pSVar47->m_depthStencilClear).m_ptr;
    if (v != (DepthStencilClear *)0x0) {
      tcu::Vector<unsigned_int,_2>::Vector(&offset,&v->m_offset);
      tcu::Vector<unsigned_int,_2>::Vector(&size,&v->m_size);
      uVar22 = (local_438->m_depthStencilAttachment).m_attachment;
      format_3 = ::vk::mapVkFormat((local_480->m_attachments).
                                   super__Vector_base<vkt::(anonymous_namespace)::Attachment,_std::allocator<vkt::(anonymous_namespace)::Attachment>_>
                                   ._M_impl.super__Vector_impl_data._M_start[uVar22].m_format);
      bVar48 = tcu::hasStencilComponent(format_3.order);
      bVar19 = tcu::hasDepthComponent(format_3.order);
      VVar17 = _format;
      VVar15 = origin;
      uVar12 = v->m_depth;
      uVar13 = v->m_stencil;
      format.type = uVar13;
      format.order = uVar12;
      TStack_2e0 = VVar17._8_8_;
      origin.m_data[0]._1_1_ = bVar48;
      origin.m_data[0]._0_1_ = bVar19;
      origin.m_data[1] = VVar15.m_data[1];
      origin.m_data[0]._2_2_ = 0;
      PVar21 = clearValueToPixelValue((VkClearValue *)&format,&format_3);
      p.m_data[0]._0_2_ = PVar21.m_status;
      clearReferenceValues
                (local_468 + uVar22,targetSize,&offset,&size,(BVec4 *)&origin,(PixelValue *)&p);
    }
    pRVar6 = (pSVar47->m_renderQuad).m_ptr;
    uVar45 = index;
    if (pRVar6 != (RenderQuad *)0x0) {
      tcu::Vector<float,_2>::Vector
                ((Vector<float,_2> *)&size,
                 *(Vector<float,_2> **)
                  &(pRVar6->m_vertices).
                   super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                );
      tcu::Vector<float,_2>::Vector
                ((Vector<float,_2> *)&format_3,
                 (Vector<float,_2> *)
                 (*(long *)&(pRVar6->m_vertices).
                            super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                 + 0x10));
      uVar45 = *(ulong *)(pSVar47->m_viewportOffset).m_data;
      auVar51._0_8_ = uVar45 & 0xffffffff;
      auVar51._8_4_ = (int)(uVar45 >> 0x20);
      auVar51._12_4_ = 0;
      TVar29.order = (float)(SUB168(auVar51 | _DAT_0095eac0,0) - (double)DAT_0095eac0);
      TVar29.type = (float)(SUB168(auVar51 | _DAT_0095eac0,8) - DAT_0095eac0._8_8_);
      uVar45 = *(ulong *)(pSVar47->m_viewportSize).m_data;
      auVar52._0_8_ = uVar45 & 0xffffffff;
      auVar52._8_4_ = (int)(uVar45 >> 0x20);
      auVar52._12_4_ = 0;
      p.m_data[0] = (float)(SUB168(auVar52 | _DAT_0095eac0,0) - (double)DAT_0095eac0);
      p.m_data[1] = (float)(SUB168(auVar52 | _DAT_0095eac0,8) - DAT_0095eac0._8_8_);
      local_458._M_dataplus._M_p = &DAT_4000000040000000;
      format = TVar29;
      tcu::operator/(&p,(Vector<float,_2> *)&local_458);
      tcu::operator+((Vector<float,_2> *)&((VkClearValue *)&format)->depthStencil,
                     (Vector<float,_2> *)&offset);
      uVar45 = *(ulong *)(pSVar47->m_viewportSize).m_data;
      auVar53._0_8_ = uVar45 & 0xffffffff;
      auVar53._8_4_ = (int)(uVar45 >> 0x20);
      auVar53._12_4_ = 0;
      format.type = (ChannelType)(float)(SUB168(auVar53 | _DAT_0095eac0,8) - DAT_0095eac0._8_8_);
      format.order = (ChannelOrder)(float)(SUB168(auVar53 | _DAT_0095eac0,0) - (double)DAT_0095eac0)
      ;
      offset.m_data = (uint  [2])&DAT_4000000040000000;
      tcu::operator/((Vector<float,_2> *)&((VkClearValue *)&format)->depthStencil,
                     (Vector<float,_2> *)&offset);
      fVar50 = (float)format_3.order * p.m_data[0] + origin.m_data[0];
      fVar54 = (float)format_3.type * p.m_data[1] + origin.m_data[1];
      fVar55 = (float)CONCAT62(size.m_data._2_6_,size.m_data[0]._0_2_) * p.m_data[0] +
               origin.m_data[0];
      fVar56 = size.m_data[1] * p.m_data[1] + origin.m_data[1];
      auVar10._4_4_ = -(uint)(fVar54 < 0.0);
      auVar10._0_4_ = -(uint)(fVar50 < 0.0);
      auVar10._8_4_ = -(uint)(fVar55 < 0.0);
      auVar10._12_4_ = -(uint)(fVar56 < 0.0);
      uVar22 = movmskps(extraout_EAX,auVar10);
      fVar57 = -0.5;
      if ((uVar22 & 4) == 0) {
        fVar57 = 0.5;
      }
      fVar58 = -0.5;
      if ((uVar22 & 8) == 0) {
        fVar58 = 0.5;
      }
      fVar59 = -0.5;
      if ((uVar22 & 1) == 0) {
        fVar59 = 0.5;
      }
      fVar60 = -0.5;
      if ((uVar22 & 2) == 0) {
        fVar60 = 0.5;
      }
      local_404 = (int)(fVar55 + fVar57);
      local_408 = (int)(fVar56 + fVar58);
      local_3fc = (int)(fVar59 + fVar50);
      local_400 = (int)(fVar54 + fVar60);
      if ((local_438->m_inputAttachments).
          super__Vector_base<vkt::(anonymous_namespace)::AttachmentReference,_std::allocator<vkt::(anonymous_namespace)::AttachmentReference>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          (local_438->m_inputAttachments).
          super__Vector_base<vkt::(anonymous_namespace)::AttachmentReference,_std::allocator<vkt::(anonymous_namespace)::AttachmentReference>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        pTVar38 = (TextureLevel *)0x0;
        while( true ) {
          lVar44 = *(long *)&(local_438->m_colorAttachments).
                             super__Vector_base<vkt::(anonymous_namespace)::AttachmentReference,_std::allocator<vkt::(anonymous_namespace)::AttachmentReference>_>
                             ._M_impl.super__Vector_impl_data;
          if ((TextureLevel *)
              ((long)(local_438->m_colorAttachments).
                     super__Vector_base<vkt::(anonymous_namespace)::AttachmentReference,_std::allocator<vkt::(anonymous_namespace)::AttachmentReference>_>
                     ._M_impl.super__Vector_impl_data._M_finish - lVar44 >> 3) <= pTVar38) break;
          uVar22 = *(uint *)(lVar44 + (long)pTVar38 * 8);
          uVar45 = (ulong)uVar22;
          local_428 = pTVar38;
          TVar29 = ::vk::mapVkFormat((local_480->m_attachments).
                                     super__Vector_base<vkt::(anonymous_namespace)::Attachment,_std::allocator<vkt::(anonymous_namespace)::Attachment>_>
                                     ._M_impl.super__Vector_impl_data._M_start[uVar45].m_format);
          format = TVar29;
          tcu::getTextureFormatChannelMask((tcu *)&offset,&format);
          local_470 = local_468 + uVar45;
          local_478 = uVar45 + index;
          local_430 = (ulong)((int)index + uVar22);
          for (iVar23 = local_408; iVar23 < local_400; iVar23 = iVar23 + 1) {
            for (iVar25 = local_404; iVar25 < local_3fc; iVar25 = iVar25 + 1) {
              for (sVar43 = 0; sVar43 != 4; sVar43 = sVar43 + 1) {
                if (*(char *)((long)offset.m_data + sVar43) == '\x01') {
                  uVar24 = (int)local_430 + (int)sVar43;
                  uVar22 = targetSize->m_data[0];
                  pPVar4 = (local_470->
                           super__Vector_base<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
                           )._M_impl.super__Vector_impl_data._M_start;
                  bVar48 = performBoolOp(*(BoolOp *)
                                          (&DAT_0095eb00 +
                                          (ulong)((int)local_478 + (int)sVar43 & 3) * 4),
                                         iVar25 % 2 == (uVar24 & 1),
                                         iVar23 % 2 == (uint)((uVar24 >> 1 & 1) != 0));
                  PixelValue::setValue(pPVar4 + (uVar22 * iVar23 + iVar25),sVar43,bVar48);
                }
              }
            }
          }
          pTVar38 = (TextureLevel *)
                    ((long)&(((_Vector_base<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
                               *)&local_428->m_format)->_M_impl).super__Vector_impl_data._M_start +
                    1);
        }
        uVar46 = (ulong)(local_438->m_depthStencilAttachment).m_attachment;
        uVar45 = index;
        if (uVar46 != 0xffffffff) {
          TVar29 = ::vk::mapVkFormat((local_480->m_attachments).
                                     super__Vector_base<vkt::(anonymous_namespace)::Attachment,_std::allocator<vkt::(anonymous_namespace)::Attachment>_>
                                     ._M_impl.super__Vector_impl_data._M_start[uVar46].m_format);
          pvVar28 = local_468 + uVar46;
          uVar22 = (uint)(index + 1);
          local_430 = (ulong)(uVar22 & 3);
          local_428 = (TextureLevel *)(CONCAT44(local_428._4_4_,uVar22) & 0xffffffff00000001);
          local_478 = (ulong)((uint)(index + 1 >> 1) & 1);
          uVar45 = index;
          for (iVar23 = local_408; iVar23 < local_400; iVar23 = iVar23 + 1) {
            local_470 = (vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
                         *)CONCAT44(local_470._4_4_,iVar23 % 2);
            for (iVar25 = local_404; iVar25 < local_3fc; iVar25 = iVar25 + 1) {
              bVar48 = tcu::hasDepthComponent(TVar29.order);
              if (bVar48) {
                uVar22 = targetSize->m_data[0] * iVar23 + iVar25;
                pPVar4 = (pvVar28->
                         super__Vector_base<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
                         )._M_impl.super__Vector_impl_data._M_start;
                bVar48 = performBoolOp(*(BoolOp *)(&DAT_0095eb00 + local_430 * 4),
                                       iVar25 % 2 == (int)local_428,
                                       (uint)local_470 == (int)local_478);
                uVar1 = pPVar4[uVar22].m_status;
                uVar41 = uVar1 | 3;
                if (!bVar48) {
                  uVar41 = (uVar1 & 0xfffc) + 1;
                }
                pPVar4[uVar22].m_status = uVar41;
                uVar45 = index;
              }
              bVar48 = tcu::hasStencilComponent(TVar29.order);
              if (bVar48) {
                uVar22 = targetSize->m_data[0] * iVar23 + iVar25;
                pPVar4 = (pvVar28->
                         super__Vector_base<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
                         )._M_impl.super__Vector_impl_data._M_start;
                uVar1 = pPVar4[uVar22].m_status;
                uVar41 = uVar1 | 0xc;
                if ((uVar45 & 1) != 0) {
                  uVar41 = uVar1 & 0xfff3 | 4;
                }
                pPVar4[uVar22].m_status = uVar41;
              }
            }
          }
        }
      }
      else {
        _format = (VkClearValue)ZEXT416(0);
        local_280 = 0;
        for (uVar45 = 0;
            lVar44 = *(long *)&(local_438->m_colorAttachments).
                               super__Vector_base<vkt::(anonymous_namespace)::AttachmentReference,_std::allocator<vkt::(anonymous_namespace)::AttachmentReference>_>
                               ._M_impl.super__Vector_impl_data,
            uVar45 < (ulong)((long)(local_438->m_colorAttachments).
                                   super__Vector_base<vkt::(anonymous_namespace)::AttachmentReference,_std::allocator<vkt::(anonymous_namespace)::AttachmentReference>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - lVar44 >> 3);
            uVar45 = uVar45 + 1) {
          TVar29 = ::vk::mapVkFormat((local_480->m_attachments).
                                     super__Vector_base<vkt::(anonymous_namespace)::Attachment,_std::allocator<vkt::(anonymous_namespace)::Attachment>_>
                                     ._M_impl.super__Vector_impl_data._M_start
                                     [*(uint *)(lVar44 + uVar45 * 8)].m_format);
          iVar23 = tcu::getNumUsedChannels(TVar29.order);
          local_280 = local_280 + iVar23;
        }
        uVar45 = local_280 +
                 (ulong)((local_438->m_depthStencilAttachment).m_attachment != 0xffffffff);
        iVar23 = local_408;
        while (iVar23 < local_400) {
          local_430 = CONCAT44(local_430._4_4_,iVar23);
          iVar25 = local_404;
          while( true ) {
            if (local_3fc <= iVar25) break;
            local_478 = CONCAT44(local_478._4_4_,iVar25);
            for (uVar46 = 0;
                lVar44 = *(long *)&(local_438->m_inputAttachments).
                                   super__Vector_base<vkt::(anonymous_namespace)::AttachmentReference,_std::allocator<vkt::(anonymous_namespace)::AttachmentReference>_>
                                   ._M_impl.super__Vector_impl_data,
                uVar46 < (ulong)((long)(local_438->m_inputAttachments).
                                       super__Vector_base<vkt::(anonymous_namespace)::AttachmentReference,_std::allocator<vkt::(anonymous_namespace)::AttachmentReference>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - lVar44 >> 3);
                uVar46 = uVar46 + 1) {
              uVar22 = *(uint *)(lVar44 + uVar46 * 8);
              TVar29 = ::vk::mapVkFormat((local_480->m_attachments).
                                         super__Vector_base<vkt::(anonymous_namespace)::Attachment,_std::allocator<vkt::(anonymous_namespace)::Attachment>_>
                                         ._M_impl.super__Vector_impl_data._M_start[uVar22].m_format)
              ;
              uVar24 = tcu::getNumUsedChannels(TVar29.order);
              if ((int)uVar24 < 1) {
                uVar24 = 0;
              }
              pvVar28 = local_468 + uVar22;
              for (uVar30 = 0; uVar24 != uVar30; uVar30 = uVar30 + 1) {
                PixelValue::getValue
                          ((PixelValue *)&offset,
                           (size_t)((pvVar28->
                                    super__Vector_base<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
                                    )._M_impl.super__Vector_impl_data._M_start +
                                   (targetSize->m_data[0] * (int)local_430 + (int)local_478)));
                std::vector<tcu::Maybe<bool>,std::allocator<tcu::Maybe<bool>>>::
                emplace_back<tcu::Maybe<bool>>
                          ((vector<tcu::Maybe<bool>,std::allocator<tcu::Maybe<bool>>> *)&format,
                           (Maybe<bool> *)&offset);
              }
            }
            uVar46 = (long)TStack_2e0 - (long)format >> 4;
            local_470 = (vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
                         *)0x1;
            if (uVar45 <= uVar46) {
              local_470 = (vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
                           *)((uVar46 / uVar45 + 1) - (ulong)(uVar46 % uVar45 == 0));
            }
            local_350 = CONCAT44(local_350._4_4_,(int)local_478 % 2);
            local_358 = 0;
            for (uVar46 = 0;
                lVar44 = *(long *)&(local_438->m_colorAttachments).
                                   super__Vector_base<vkt::(anonymous_namespace)::AttachmentReference,_std::allocator<vkt::(anonymous_namespace)::AttachmentReference>_>
                                   ._M_impl.super__Vector_impl_data,
                uVar46 < (ulong)((long)(local_438->m_colorAttachments).
                                       super__Vector_base<vkt::(anonymous_namespace)::AttachmentReference,_std::allocator<vkt::(anonymous_namespace)::AttachmentReference>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - lVar44 >> 3);
                uVar46 = uVar46 + 1) {
              uVar22 = *(uint *)(lVar44 + uVar46 * 8);
              TVar29 = ::vk::mapVkFormat((local_480->m_attachments).
                                         super__Vector_base<vkt::(anonymous_namespace)::Attachment,_std::allocator<vkt::(anonymous_namespace)::Attachment>_>
                                         ._M_impl.super__Vector_impl_data._M_start[uVar22].m_format)
              ;
              local_24c = tcu::getNumUsedChannels(TVar29.order);
              local_428 = (TextureLevel *)(local_468 + uVar22);
              uVar22 = (int)local_358 + (int)index + uVar22;
              sVar43 = 0;
              if (0 < (int)local_24c) {
                sVar43 = (size_t)local_24c;
              }
              uVar30 = (long)local_470 * local_358;
              for (ndx = 0; ndx != sVar43; ndx = ndx + 1) {
                bVar48 = performBoolOp(*(BoolOp *)(&DAT_0095eb00 + (ulong)(uVar22 & 3) * 4),
                                       (uint)local_350 == (uVar22 & 1),
                                       iVar23 % 2 == (uVar22 >> 1 & 1));
                local_3f0[0]._0_1_ = bVar48;
                offset.m_data = (uint  [2])local_3f0;
                uVar35 = uVar30;
                pvVar28 = local_470;
                while( true ) {
                  bVar48 = pvVar28 ==
                           (vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
                            *)0x0;
                  pvVar28 = (vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
                             *)((long)&pvVar28[-1].
                                       super__Vector_base<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
                  if (bVar48) break;
                  if (offset.m_data == (uint  [2])0x0) goto LAB_00440a90;
                  pdVar7 = *(deUint8 **)
                            ((long)format +
                            (uVar35 % (ulong)((long)TStack_2e0 - (long)format >> 4)) * 0x10);
                  auVar32[0] = 0;
                  auVar32[1] = 0;
                  if (pdVar7 != (deUint8 *)0x0) {
                    local_3f0[0]._0_1_ = *(deUint8 *)offset.m_data == *pdVar7;
                    auVar32 = (uint  [2])local_3f0;
                  }
                  offset.m_data[0] = auVar32[0];
                  offset.m_data[1] = auVar32[1];
                  uVar35 = uVar35 + 1;
                  offset.m_data = auVar32;
                }
                if (offset.m_data == (uint  [2])0x0) {
LAB_00440a90:
                  bVar9 = (char)ndx * '\x02' & 0x1f;
                  pPVar4 = (((_Vector_base<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
                              *)&local_428->m_format)->_M_impl).super__Vector_impl_data._M_start +
                           (targetSize->m_data[0] * (int)local_430 + (int)local_478);
                  pPVar4->m_status =
                       pPVar4->m_status &
                       ((ushort)(-2 << bVar9) | (ushort)(0xfffffffe >> 0x20 - bVar9));
                }
                else {
                  PixelValue::setValue
                            ((((_Vector_base<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
                                *)&local_428->m_format)->_M_impl).super__Vector_impl_data._M_start +
                             (targetSize->m_data[0] * (int)local_430 + (int)local_478),ndx,
                             *(bool *)offset.m_data);
                }
                uVar30 = (long)&(local_470->
                                super__Vector_base<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
                                )._M_impl.super__Vector_impl_data._M_start + uVar30;
              }
              local_358 = local_358 + (long)(int)local_24c;
            }
            uVar22 = (local_438->m_depthStencilAttachment).m_attachment;
            TVar29 = format;
            TVar16 = TStack_2e0;
            if ((ulong)uVar22 != 0xffffffff) {
              pvVar28 = local_468 + uVar22;
              uVar22 = uVar22 + (int)index;
              bVar48 = performBoolOp(*(BoolOp *)(&DAT_0095eb00 + (ulong)(uVar22 & 3) * 4),
                                     (uint)local_350 == (uVar22 & 1),
                                     iVar23 % 2 == (uint)((uVar22 >> 1 & 1) != 0));
              local_3f0[0]._0_1_ = bVar48;
              offset.m_data = (uint  [2])local_3f0;
              local_358 = local_358 * (long)local_470;
              while( true ) {
                bVar48 = local_470 ==
                         (vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
                          *)0x0;
                local_470 = (vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
                             *)((long)&local_470[-1].
                                       super__Vector_base<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
                if (bVar48) break;
                if (offset.m_data == (uint  [2])0x0) goto LAB_00440c28;
                pdVar7 = *(deUint8 **)
                          ((long)TVar29 +
                          (local_358 % (ulong)((long)TVar16 - (long)TVar29 >> 4)) * 0x10);
                auVar33[0] = 0;
                auVar33[1] = 0;
                if (pdVar7 != (deUint8 *)0x0) {
                  local_3f0[0]._0_1_ = *(deUint8 *)offset.m_data == *pdVar7;
                  auVar33 = (uint  [2])local_3f0;
                }
                offset.m_data[0] = auVar33[0];
                offset.m_data[1] = auVar33[1];
                local_358 = local_358 + 1;
                offset.m_data = auVar33;
              }
              if (offset.m_data == (uint  [2])0x0) {
LAB_00440c28:
                pPVar4 = (pvVar28->
                         super__Vector_base<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
                         )._M_impl.super__Vector_impl_data._M_start +
                         (targetSize->m_data[0] * (int)local_430 + (int)local_478);
                pPVar4->m_status = pPVar4->m_status & 0xfffe;
              }
              else {
                uVar22 = targetSize->m_data[0] * (int)local_430 + (int)local_478;
                pPVar4 = (pvVar28->
                         super__Vector_base<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
                         )._M_impl.super__Vector_impl_data._M_start;
                uVar1 = pPVar4[uVar22].m_status;
                uVar41 = uVar1 | 3;
                if (*(deUint8 *)offset.m_data == '\0') {
                  uVar41 = (uVar1 & 0xfffc) + 1;
                }
                pPVar4[uVar22].m_status = uVar41;
              }
            }
            if (TVar16 != TVar29) {
              TVar16 = format;
              format.order = TVar29.order;
              format.type = TVar29.type;
              TStack_2e0.order = format.order;
              TStack_2e0.type = format.type;
              format = TVar16;
            }
            iVar25 = (int)local_478 + 1;
          }
          iVar23 = (int)local_430 + 1;
        }
        uVar45 = (ulong)(local_438->m_depthStencilAttachment).m_attachment;
        if (uVar45 != 0xffffffff) {
          TVar29 = ::vk::mapVkFormat((local_480->m_attachments).
                                     super__Vector_base<vkt::(anonymous_namespace)::Attachment,_std::allocator<vkt::(anonymous_namespace)::Attachment>_>
                                     ._M_impl.super__Vector_impl_data._M_start[uVar45].m_format);
          local_468 = referenceValues.
                      super__Vector_base<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>,_std::allocator<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
          bVar48 = tcu::hasStencilComponent(TVar29.order);
          if (bVar48) {
            for (iVar23 = local_408; iVar23 < local_400; iVar23 = iVar23 + 1) {
              uVar22 = targetSize->m_data[0];
              for (iVar25 = local_404; iVar25 < local_3fc; iVar25 = iVar25 + 1) {
                uVar24 = uVar22 * iVar23 + iVar25;
                pPVar4 = local_468[uVar45].
                         super__Vector_base<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                uVar1 = pPVar4[uVar24].m_status;
                uVar41 = uVar1 | 0xc;
                if ((index & 1) != 0) {
                  uVar41 = uVar1 & 0xfff3 | 4;
                }
                pPVar4[uVar24].m_status = uVar41;
              }
            }
          }
        }
        std::_Vector_base<tcu::Maybe<bool>,_std::allocator<tcu::Maybe<bool>_>_>::~_Vector_base
                  ((_Vector_base<tcu::Maybe<bool>,_std::allocator<tcu::Maybe<bool>_>_> *)&format);
        uVar45 = index;
      }
    }
    pRVar39 = local_480;
  }
  lVar44 = 0;
  pvVar28 = local_468;
  for (uVar45 = 0;
      pAVar34 = (local_480->m_attachments).
                super__Vector_base<vkt::(anonymous_namespace)::Attachment,_std::allocator<vkt::(anonymous_namespace)::Attachment>_>
                ._M_impl.super__Vector_impl_data._M_start,
      uVar45 < (ulong)((long)(local_480->m_attachments).
                             super__Vector_base<vkt::(anonymous_namespace)::Attachment,_std::allocator<vkt::(anonymous_namespace)::Attachment>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pAVar34 >> 5);
      uVar45 = uVar45 + 1) {
    TVar29 = ::vk::mapVkFormat(*(VkFormat *)((long)&pAVar34->m_format + lVar44));
    bVar48 = tcu::hasStencilComponent(TVar29.order);
    bVar19 = tcu::hasDepthComponent(TVar29.order);
    rVar61 = std::vector<bool,_std::allocator<bool>_>::operator[](&attachmentUsed,uVar45);
    if (((*rVar61._M_p & rVar61._M_mask) != 0) &&
       (*(int *)((long)&((local_480->m_attachments).
                         super__Vector_base<vkt::(anonymous_namespace)::Attachment,_std::allocator<vkt::(anonymous_namespace)::Attachment>_>
                         ._M_impl.super__Vector_impl_data._M_start)->m_storeOp + lVar44) == 1)) {
      if (bVar19 || bVar48) {
        format.order = 1;
      }
      else {
        tcu::Vector<bool,_4>::Vector((Vector<bool,_4> *)&format,true);
      }
      markUndefined(pvVar28,(BVec4 *)&format,targetSize,local_420,local_418);
    }
    rVar61 = std::vector<bool,_std::allocator<bool>_>::operator[](&attachmentUsed,uVar45);
    if ((bVar48 && (*rVar61._M_p & rVar61._M_mask) != 0) &&
       (*(int *)((long)&((local_480->m_attachments).
                         super__Vector_base<vkt::(anonymous_namespace)::Attachment,_std::allocator<vkt::(anonymous_namespace)::Attachment>_>
                         ._M_impl.super__Vector_impl_data._M_start)->m_stencilStoreOp + lVar44) == 1
       )) {
      format.order = 0x100;
      markUndefined(pvVar28,(BVec4 *)&format,targetSize,local_420,local_418);
    }
    lVar44 = lVar44 + 0x20;
    pvVar28 = pvVar28 + 1;
  }
  std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
            (&attachmentUsed.super__Bvector_base<std::allocator<bool>_>);
  std::vector<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_>::resize
            (&referenceAttachments,((long)local_208 - (long)local_468) / 0x18);
  uVar45 = 0;
  while( true ) {
    pAVar34 = (local_480->m_attachments).
              super__Vector_base<vkt::(anonymous_namespace)::Attachment,_std::allocator<vkt::(anonymous_namespace)::Attachment>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pAVar36 = (local_480->m_attachments).
              super__Vector_base<vkt::(anonymous_namespace)::Attachment,_std::allocator<vkt::(anonymous_namespace)::Attachment>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if ((ulong)((long)pAVar36 - (long)pAVar34 >> 5) <= uVar45) break;
    offset.m_data = (uint  [2])::vk::mapVkFormat(pAVar34[uVar45].m_format);
    bVar48 = tcu::hasDepthComponent(offset.m_data[0]);
    bVar19 = tcu::hasStencilComponent(offset.m_data[0]);
    local_428 = referenceAttachments.
                super__Vector_base<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_>._M_impl.
                super__Vector_impl_data._M_start + uVar45;
    tcu::TextureLevel::setStorage
              (local_428,(TextureFormat *)&offset,targetSize->m_data[0],targetSize->m_data[1],1);
    pvVar28 = local_468 + uVar45;
    local_350 = uVar45;
    if (bVar48 || bVar19) {
      if (bVar48) {
        tcu::TextureLevel::getAccess((PixelBufferAccess *)&format,local_428);
        tcu::getEffectiveDepthStencilAccess
                  ((PixelBufferAccess *)&attachmentUsed,(PixelBufferAccess *)&format,MODE_DEPTH);
        uVar46 = 0;
        while (uVar22 = (uint)uVar46, uVar22 < targetSize->m_data[1]) {
          for (uVar24 = 0; uVar24 < targetSize->m_data[0]; uVar24 = uVar24 + 1) {
            uVar1 = (pvVar28->
                    super__Vector_base<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
                    )._M_impl.super__Vector_impl_data._M_start
                    [targetSize->m_data[0] * uVar22 + uVar24].m_status;
            if ((uVar1 & 1) == 0) {
              fVar50 = *(float *)(&DAT_0095eee8 +
                                 (ulong)(((uVar24 / 3 ^ (uint)(uVar46 / 3)) & 1) == 0) * 4);
            }
            else {
              fVar50 = 0.0;
              if ((uVar1 & 2) != 0) {
                fVar50 = 1.0;
              }
            }
            tcu::PixelBufferAccess::setPixDepth
                      ((PixelBufferAccess *)&attachmentUsed,fVar50,uVar24,uVar22,0);
          }
          uVar45 = local_350;
          uVar46 = (ulong)(uVar22 + 1);
        }
      }
      if (bVar19) {
        tcu::TextureLevel::getAccess((PixelBufferAccess *)&format,local_428);
        tcu::getEffectiveDepthStencilAccess
                  ((PixelBufferAccess *)&attachmentUsed,(PixelBufferAccess *)&format,MODE_STENCIL);
        for (uVar22 = 0; uVar22 < targetSize->m_data[1]; uVar22 = uVar22 + 1) {
          for (uVar24 = 0; uVar24 < targetSize->m_data[0]; uVar24 = uVar24 + 1) {
            uVar1 = (pvVar28->
                    super__Vector_base<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
                    )._M_impl.super__Vector_impl_data._M_start
                    [targetSize->m_data[0] * uVar22 + uVar24].m_status;
            if ((uVar1 & 4) == 0) {
              stencil = 0x55;
              if (((uVar24 / 3 ^ uVar22 / 3) & 1) != 0) {
                stencil = 0xaa;
              }
            }
            else {
              stencil = uVar1 & 8;
              if ((uVar1 & 8) != 0) {
                stencil = 0xff;
              }
            }
            tcu::PixelBufferAccess::setPixStencil
                      ((PixelBufferAccess *)&attachmentUsed,stencil,uVar24,uVar22,0);
          }
          uVar45 = local_350;
        }
      }
    }
    else {
      uVar22 = 0;
      while (uVar45 = local_350, uVar22 < targetSize->m_data[1]) {
        local_478 = CONCAT44(local_478._4_4_,uVar22);
        local_470 = (vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
                     *)CONCAT44(local_470._4_4_,uVar22 / 3);
        uVar45 = 0;
        while( true ) {
          if (targetSize->m_data[0] <= (uint)uVar45) break;
          tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&format);
          uVar22 = targetSize->m_data[0] * (int)local_478 + (uint)uVar45;
          local_430 = uVar45;
          for (lVar44 = 0; lVar44 != 4; lVar44 = lVar44 + 1) {
            PixelValue::getValue
                      ((PixelValue *)&attachmentUsed,
                       (size_t)((pvVar28->
                                super__Vector_base<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
                                )._M_impl.super__Vector_impl_data._M_start + uVar22));
            if (attachmentUsed.super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p == (_Bit_type *)0x0)
            {
              (&format.order)[lVar44] =
                   *(ChannelOrder *)
                    (&DAT_0095eee8 +
                    (ulong)((((int)(uVar45 / 3) + (int)lVar44 ^ (uint)local_470) & 1) == 0) * 4);
            }
            else {
              PixelValue::getValue
                        ((PixelValue *)&attachmentUsed,
                         (size_t)((pvVar28->
                                  super__Vector_base<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
                                  )._M_impl.super__Vector_impl_data._M_start + uVar22));
              if ((char)*attachmentUsed.super__Bvector_base<std::allocator<bool>_>._M_impl.
                         super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p == '\x01')
              {
                (&format.order)[lVar44] = 0x3f800000;
              }
              else {
                (&format.order)[lVar44] = R;
              }
            }
          }
          tcu::TextureLevel::getAccess((PixelBufferAccess *)&attachmentUsed,local_428);
          uVar45 = local_430;
          tcu::PixelBufferAccess::setPixel
                    ((PixelBufferAccess *)&attachmentUsed,(Vec4 *)&format,(int)local_430,
                     (int)local_478,0);
          uVar45 = uVar45 + 1;
        }
        uVar22 = (int)local_478 + 1;
      }
    }
    uVar45 = uVar45 + 1;
  }
  local_488 = 0;
  pRVar39 = local_480;
  local_478._0_4_ = (int)CONCAT71((int7)((long)pAVar36 - (long)pAVar34 >> 0xd),1);
  do {
    if ((ulong)((long)pAVar36 - (long)pAVar34 >> 5) <= local_488) {
      std::vector<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_>::~vector
                (&referenceAttachments);
      std::
      vector<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>,_std::allocator<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>_>_>
      ::~vector(&referenceValues);
      return (bool)((byte)(int)local_478 & 1);
    }
    cVar20 = std::vector<bool,_std::allocator<bool>_>::operator[](attachmentIsLazy,local_488);
    if (!cVar20) {
      format_00 = (pRVar39->m_attachments).
                  super__Vector_base<vkt::(anonymous_namespace)::Attachment,_std::allocator<vkt::(anonymous_namespace)::Attachment>_>
                  ._M_impl.super__Vector_impl_data._M_start[local_488].m_format;
      format_7 = ::vk::mapVkFormat(format_00);
      bVar48 = tcu::hasDepthComponent(format_7.order);
      if (bVar48) {
        bVar48 = tcu::hasStencilComponent(format_7.order);
        if (!bVar48) goto LAB_00441cee;
        depthFormat = ::vk::getDepthCopyFormat(format_00);
        tcu::TextureFormat::getPixelSize(&depthFormat);
        pvVar8 = *(void **)(*(long *)&(((local_258->
                                        super__Vector_base<de::SharedPtr<vkt::(anonymous_namespace)::AttachmentResources>,_std::allocator<de::SharedPtr<vkt::(anonymous_namespace)::AttachmentResources>_>_>
                                        )._M_impl.super__Vector_impl_data._M_start[local_488].m_ptr)
                                      ->m_bufferMemory).
                                      super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>
                                      .m_data + 0x18);
        stencilFormat = ::vk::getStencilCopyFormat(format_00);
        tcu::TextureFormat::getPixelSize(&stencilFormat);
        data = *(void **)(*(long *)&(((local_258->
                                      super__Vector_base<de::SharedPtr<vkt::(anonymous_namespace)::AttachmentResources>,_std::allocator<de::SharedPtr<vkt::(anonymous_namespace)::AttachmentResources>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start[local_488].m_ptr)->
                                    m_secondaryBufferMemory).
                                    super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>
                                    .m_data + 0x18);
        format.order = 6;
        TStack_2e0 = (TextureFormat)0x0;
        VVar26 = (*vk->_vptr_DeviceInterface[10])(vk,device,2,&format);
        ::vk::checkResult(VVar26,"vk.invalidateMappedMemoryRanges(device, 2u, ranges)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/vktRenderPassTests.cpp"
                          ,0xd35);
        tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                  ((ConstPixelBufferAccess *)&offset,&depthFormat,targetSize->m_data[0],
                   targetSize->m_data[1],1,pvVar8);
        tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                  ((ConstPixelBufferAccess *)&size,&stencilFormat,targetSize->m_data[0],
                   targetSize->m_data[1],1,data);
        pRVar39 = local_480;
        attachmentUsed.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x300000008;
        tcu::TextureLevel::TextureLevel
                  ((TextureLevel *)&format_3,(TextureFormat *)&attachmentUsed,targetSize->m_data[0],
                   targetSize->m_data[1],1);
        attachmentUsed.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x300000008;
        tcu::TextureLevel::TextureLevel
                  ((TextureLevel *)&origin,(TextureFormat *)&attachmentUsed,targetSize->m_data[0],
                   targetSize->m_data[1],1);
        de::toString<unsigned_long>(&local_378,&local_488);
        std::operator+(&local_458,"Attachment",&local_378);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&p,
                       &local_458,"Depth");
        de::toString<unsigned_long>(&local_1d0,&local_488);
        std::operator+(&local_248,"Attachment ",&local_1d0);
        std::operator+(&local_278,&local_248," Depth");
        pCVar37 = (ConstPixelBufferAccess *)&offset;
        tcu::LogImage::LogImage
                  ((LogImage *)&attachmentUsed,(string *)&p,&local_278,pCVar37,
                   QP_IMAGE_COMPRESSION_MODE_BEST);
        tcu::LogImage::write((LogImage *)&attachmentUsed,(int)local_460,__buf,(size_t)pCVar37);
        tcu::LogImage::~LogImage((LogImage *)&attachmentUsed);
        std::__cxx11::string::~string((string *)&local_278);
        std::__cxx11::string::~string((string *)&local_248);
        std::__cxx11::string::~string((string *)&local_1d0);
        std::__cxx11::string::~string((string *)&p);
        std::__cxx11::string::~string((string *)&local_458);
        std::__cxx11::string::~string((string *)&local_378);
        de::toString<unsigned_long>(&local_378,&local_488);
        std::operator+(&local_458,"Attachment",&local_378);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&p,
                       &local_458,"Stencil");
        de::toString<unsigned_long>(&local_1d0,&local_488);
        std::operator+(&local_248,"Attachment ",&local_1d0);
        std::operator+(&local_278,&local_248," Stencil");
        pCVar37 = (ConstPixelBufferAccess *)&size;
        tcu::LogImage::LogImage
                  ((LogImage *)&attachmentUsed,(string *)&p,&local_278,pCVar37,
                   QP_IMAGE_COMPRESSION_MODE_BEST);
        tcu::LogImage::write((LogImage *)&attachmentUsed,(int)local_460,__buf_00,(size_t)pCVar37);
        tcu::LogImage::~LogImage((LogImage *)&attachmentUsed);
        std::__cxx11::string::~string((string *)&local_278);
        std::__cxx11::string::~string((string *)&local_248);
        std::__cxx11::string::~string((string *)&local_1d0);
        std::__cxx11::string::~string((string *)&p);
        std::__cxx11::string::~string((string *)&local_458);
        std::__cxx11::string::~string((string *)&local_378);
        de::toString<unsigned_long>(&local_378,&local_488);
        std::operator+(&local_458,"AttachmentReference",&local_378);
        de::toString<unsigned_long>(&local_248,&local_488);
        std::operator+(&local_278,"Attachment reference ",&local_248);
        pCVar37 = (ConstPixelBufferAccess *)&p;
        tcu::TextureLevel::getAccess
                  ((PixelBufferAccess *)pCVar37,
                   referenceAttachments.
                   super__Vector_base<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_>._M_impl
                   .super__Vector_impl_data._M_start + local_488);
        tcu::LogImage::LogImage
                  ((LogImage *)&attachmentUsed,&local_458,&local_278,pCVar37,
                   QP_IMAGE_COMPRESSION_MODE_BEST);
        tcu::LogImage::write((LogImage *)&attachmentUsed,(int)local_460,__buf_01,(size_t)pCVar37);
        tcu::LogImage::~LogImage((LogImage *)&attachmentUsed);
        std::__cxx11::string::~string((string *)&local_278);
        std::__cxx11::string::~string((string *)&local_248);
        std::__cxx11::string::~string((string *)&local_458);
        std::__cxx11::string::~string((string *)&local_378);
        pvVar18 = referenceValues.
                  super__Vector_base<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>,_std::allocator<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        sVar14 = local_488;
        if ((pRVar39->m_attachments).
            super__Vector_base<vkt::(anonymous_namespace)::Attachment,_std::allocator<vkt::(anonymous_namespace)::Attachment>_>
            ._M_impl.super__Vector_impl_data._M_start[local_488].m_storeOp ==
            VK_ATTACHMENT_STORE_OP_STORE) {
          tcu::TextureLevel::getAccess
                    ((PixelBufferAccess *)&attachmentUsed,(TextureLevel *)&format_3);
          bVar48 = verifyDepthAttachment
                             (pvVar18 + sVar14,(ConstPixelBufferAccess *)&offset,
                              (PixelBufferAccess *)&attachmentUsed);
          pRVar39 = local_480;
          if (!bVar48) {
            de::toString<unsigned_long>(&local_378,&local_488);
            std::operator+(&local_458,"DepthAttachmentError",&local_378);
            de::toString<unsigned_long>(&local_248,&local_488);
            std::operator+(&local_278,"Depth Attachment Error ",&local_248);
            pCVar37 = (ConstPixelBufferAccess *)&p;
            tcu::TextureLevel::getAccess((PixelBufferAccess *)pCVar37,(TextureLevel *)&format_3);
            tcu::LogImage::LogImage
                      ((LogImage *)&attachmentUsed,&local_458,&local_278,pCVar37,
                       QP_IMAGE_COMPRESSION_MODE_BEST);
            tcu::LogImage::write
                      ((LogImage *)&attachmentUsed,(int)local_460,__buf_02,(size_t)pCVar37);
            tcu::LogImage::~LogImage((LogImage *)&attachmentUsed);
            std::__cxx11::string::~string((string *)&local_278);
            std::__cxx11::string::~string((string *)&local_248);
            std::__cxx11::string::~string((string *)&local_458);
            std::__cxx11::string::~string((string *)&local_378);
            local_478._0_4_ = 0;
          }
        }
        pvVar18 = referenceValues.
                  super__Vector_base<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>,_std::allocator<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        sVar14 = local_488;
        if ((pRVar39->m_attachments).
            super__Vector_base<vkt::(anonymous_namespace)::Attachment,_std::allocator<vkt::(anonymous_namespace)::Attachment>_>
            ._M_impl.super__Vector_impl_data._M_start[local_488].m_stencilStoreOp ==
            VK_ATTACHMENT_STORE_OP_STORE) {
          tcu::TextureLevel::getAccess((PixelBufferAccess *)&attachmentUsed,(TextureLevel *)&origin)
          ;
          bVar48 = verifyStencilAttachment
                             (pvVar18 + sVar14,(ConstPixelBufferAccess *)&size,
                              (PixelBufferAccess *)&attachmentUsed);
          pRVar39 = local_480;
          if (!bVar48) {
            de::toString<unsigned_long>(&local_378,&local_488);
            std::operator+(&local_458,"StencilAttachmentError",&local_378);
            de::toString<unsigned_long>(&local_248,&local_488);
            std::operator+(&local_278,"Stencil Attachment Error ",&local_248);
            pCVar37 = (ConstPixelBufferAccess *)&p;
            tcu::TextureLevel::getAccess((PixelBufferAccess *)pCVar37,(TextureLevel *)&origin);
            tcu::LogImage::LogImage
                      ((LogImage *)&attachmentUsed,&local_458,&local_278,pCVar37,
                       QP_IMAGE_COMPRESSION_MODE_BEST);
            tcu::LogImage::write
                      ((LogImage *)&attachmentUsed,(int)local_460,__buf_03,(size_t)pCVar37);
            tcu::LogImage::~LogImage((LogImage *)&attachmentUsed);
            std::__cxx11::string::~string((string *)&local_278);
            std::__cxx11::string::~string((string *)&local_248);
            std::__cxx11::string::~string((string *)&local_458);
            std::__cxx11::string::~string((string *)&local_378);
            local_478._0_4_ = 0;
          }
        }
        tcu::TextureLevel::~TextureLevel((TextureLevel *)&origin);
        pTVar38 = (TextureLevel *)&format_3;
      }
      else {
LAB_00441cee:
        tcu::TextureFormat::getPixelSize(&format_7);
        pvVar8 = *(void **)(*(long *)&(((local_258->
                                        super__Vector_base<de::SharedPtr<vkt::(anonymous_namespace)::AttachmentResources>,_std::allocator<de::SharedPtr<vkt::(anonymous_namespace)::AttachmentResources>_>_>
                                        )._M_impl.super__Vector_impl_data._M_start[local_488].m_ptr)
                                      ->m_bufferMemory).
                                      super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>
                                      .m_data + 0x18);
        format.order = 6;
        TStack_2e0 = (TextureFormat)0x0;
        VVar26 = (*vk->_vptr_DeviceInterface[10])(vk,device,1,&format);
        ::vk::checkResult(VVar26,"vk.invalidateMappedMemoryRanges(device, 1u, &range)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/vktRenderPassTests.cpp"
                          ,0xd5e);
        bVar48 = tcu::hasDepthComponent(format_7.order);
        if (bVar48) {
          tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                    ((ConstPixelBufferAccess *)&offset,&format_7,targetSize->m_data[0],
                     targetSize->m_data[1],1,pvVar8);
          attachmentUsed.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
          ._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x300000008;
          tcu::TextureLevel::TextureLevel
                    ((TextureLevel *)&size,(TextureFormat *)&attachmentUsed,targetSize->m_data[0],
                     targetSize->m_data[1],1);
          pRVar39 = local_480;
          de::toString<unsigned_long>((string *)&origin,&local_488);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &format_3,"Attachment",(string *)&origin);
          de::toString<unsigned_long>(&local_458,&local_488);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&p,
                         "Attachment ",&local_458);
          pCVar37 = (ConstPixelBufferAccess *)&offset;
          tcu::LogImage::LogImage
                    ((LogImage *)&attachmentUsed,(string *)&format_3,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&p,pCVar37
                     ,QP_IMAGE_COMPRESSION_MODE_BEST);
          tcu::LogImage::write((LogImage *)&attachmentUsed,(int)local_460,__buf_04,(size_t)pCVar37);
          tcu::LogImage::~LogImage((LogImage *)&attachmentUsed);
          std::__cxx11::string::~string((string *)&p);
          std::__cxx11::string::~string((string *)&local_458);
          std::__cxx11::string::~string((string *)&format_3);
          std::__cxx11::string::~string((string *)&origin);
          de::toString<unsigned_long>((string *)&p,&local_488);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &origin,"AttachmentReference",(string *)&p);
          de::toString<unsigned_long>(&local_378,&local_488);
          std::operator+(&local_458,"Attachment reference ",&local_378);
          pCVar37 = (ConstPixelBufferAccess *)&format_3;
          tcu::TextureLevel::getAccess
                    ((PixelBufferAccess *)pCVar37,
                     referenceAttachments.
                     super__Vector_base<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_>.
                     _M_impl.super__Vector_impl_data._M_start + local_488);
          tcu::LogImage::LogImage
                    ((LogImage *)&attachmentUsed,(string *)&origin,&local_458,pCVar37,
                     QP_IMAGE_COMPRESSION_MODE_BEST);
          tcu::LogImage::write((LogImage *)&attachmentUsed,(int)local_460,__buf_05,(size_t)pCVar37);
          tcu::LogImage::~LogImage((LogImage *)&attachmentUsed);
          std::__cxx11::string::~string((string *)&local_458);
          std::__cxx11::string::~string((string *)&local_378);
          std::__cxx11::string::~string((string *)&origin);
          std::__cxx11::string::~string((string *)&p);
          pvVar18 = referenceValues.
                    super__Vector_base<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>,_std::allocator<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          sVar14 = local_488;
          pAVar34 = (pRVar39->m_attachments).
                    super__Vector_base<vkt::(anonymous_namespace)::Attachment,_std::allocator<vkt::(anonymous_namespace)::Attachment>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if ((pAVar34[local_488].m_storeOp == VK_ATTACHMENT_STORE_OP_STORE) ||
             (pAVar34[local_488].m_stencilStoreOp == VK_ATTACHMENT_STORE_OP_STORE)) {
            tcu::TextureLevel::getAccess((PixelBufferAccess *)&attachmentUsed,(TextureLevel *)&size)
            ;
            bVar48 = verifyDepthAttachment
                               (pvVar18 + sVar14,(ConstPixelBufferAccess *)&offset,
                                (PixelBufferAccess *)&attachmentUsed);
            pRVar39 = local_480;
            if (!bVar48) {
              de::toString<unsigned_long>((string *)&p,&local_488);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &origin,"AttachmentError",(string *)&p);
              de::toString<unsigned_long>(&local_378,&local_488);
              std::operator+(&local_458,"Attachment Error ",&local_378);
              pCVar37 = (ConstPixelBufferAccess *)&format_3;
              tcu::TextureLevel::getAccess((PixelBufferAccess *)pCVar37,(TextureLevel *)&size);
              tcu::LogImage::LogImage
                        ((LogImage *)&attachmentUsed,(string *)&origin,&local_458,pCVar37,
                         QP_IMAGE_COMPRESSION_MODE_BEST);
              tcu::LogImage::write
                        ((LogImage *)&attachmentUsed,(int)local_460,__buf_06,(size_t)pCVar37);
              goto LAB_004427b3;
            }
          }
        }
        else {
          bVar48 = tcu::hasStencilComponent(format_7.order);
          if (bVar48) {
            tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                      ((ConstPixelBufferAccess *)&offset,&format_7,targetSize->m_data[0],
                       targetSize->m_data[1],1,pvVar8);
            attachmentUsed.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p =
                 (_Bit_type *)0x300000008;
            tcu::TextureLevel::TextureLevel
                      ((TextureLevel *)&size,(TextureFormat *)&attachmentUsed,targetSize->m_data[0],
                       targetSize->m_data[1],1);
            pRVar39 = local_480;
            de::toString<unsigned_long>((string *)&origin,&local_488);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &format_3,"Attachment",(string *)&origin);
            de::toString<unsigned_long>(&local_458,&local_488);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&p,
                           "Attachment ",&local_458);
            pCVar37 = (ConstPixelBufferAccess *)&offset;
            tcu::LogImage::LogImage
                      ((LogImage *)&attachmentUsed,(string *)&format_3,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&p,
                       pCVar37,QP_IMAGE_COMPRESSION_MODE_BEST);
            tcu::LogImage::write
                      ((LogImage *)&attachmentUsed,(int)local_460,__buf_07,(size_t)pCVar37);
            tcu::LogImage::~LogImage((LogImage *)&attachmentUsed);
            std::__cxx11::string::~string((string *)&p);
            std::__cxx11::string::~string((string *)&local_458);
            std::__cxx11::string::~string((string *)&format_3);
            std::__cxx11::string::~string((string *)&origin);
            de::toString<unsigned_long>((string *)&p,&local_488);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &origin,"AttachmentReference",(string *)&p);
            de::toString<unsigned_long>(&local_378,&local_488);
            std::operator+(&local_458,"Attachment reference ",&local_378);
            pCVar37 = (ConstPixelBufferAccess *)&format_3;
            tcu::TextureLevel::getAccess
                      ((PixelBufferAccess *)pCVar37,
                       referenceAttachments.
                       super__Vector_base<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_>.
                       _M_impl.super__Vector_impl_data._M_start + local_488);
            tcu::LogImage::LogImage
                      ((LogImage *)&attachmentUsed,(string *)&origin,&local_458,pCVar37,
                       QP_IMAGE_COMPRESSION_MODE_BEST);
            tcu::LogImage::write
                      ((LogImage *)&attachmentUsed,(int)local_460,__buf_08,(size_t)pCVar37);
            tcu::LogImage::~LogImage((LogImage *)&attachmentUsed);
            std::__cxx11::string::~string((string *)&local_458);
            std::__cxx11::string::~string((string *)&local_378);
            std::__cxx11::string::~string((string *)&origin);
            std::__cxx11::string::~string((string *)&p);
            pvVar18 = referenceValues.
                      super__Vector_base<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>,_std::allocator<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            sVar14 = local_488;
            pAVar34 = (pRVar39->m_attachments).
                      super__Vector_base<vkt::(anonymous_namespace)::Attachment,_std::allocator<vkt::(anonymous_namespace)::Attachment>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            if ((pAVar34[local_488].m_storeOp == VK_ATTACHMENT_STORE_OP_STORE) ||
               (pAVar34[local_488].m_stencilStoreOp == VK_ATTACHMENT_STORE_OP_STORE)) {
              tcu::TextureLevel::getAccess
                        ((PixelBufferAccess *)&attachmentUsed,(TextureLevel *)&size);
              bVar48 = verifyStencilAttachment
                                 (pvVar18 + sVar14,(ConstPixelBufferAccess *)&offset,
                                  (PixelBufferAccess *)&attachmentUsed);
              pRVar39 = local_480;
              if (!bVar48) {
                de::toString<unsigned_long>((string *)&p,&local_488);
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &origin,"AttachmentError",(string *)&p);
                de::toString<unsigned_long>(&local_378,&local_488);
                std::operator+(&local_458,"Attachment Error ",&local_378);
                pCVar37 = (ConstPixelBufferAccess *)&format_3;
                tcu::TextureLevel::getAccess((PixelBufferAccess *)pCVar37,(TextureLevel *)&size);
                tcu::LogImage::LogImage
                          ((LogImage *)&attachmentUsed,(string *)&origin,&local_458,pCVar37,
                           QP_IMAGE_COMPRESSION_MODE_BEST);
                tcu::LogImage::write
                          ((LogImage *)&attachmentUsed,(int)local_460,__buf_09,(size_t)pCVar37);
LAB_004427b3:
                tcu::LogImage::~LogImage((LogImage *)&attachmentUsed);
                std::__cxx11::string::~string((string *)&local_458);
                std::__cxx11::string::~string((string *)&local_378);
                std::__cxx11::string::~string((string *)&origin);
                std::__cxx11::string::~string((string *)&p);
                local_478._0_4_ = 0;
              }
            }
          }
          else {
            tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                      ((ConstPixelBufferAccess *)&offset,&format_7,targetSize->m_data[0],
                       targetSize->m_data[1],1,pvVar8);
            attachmentUsed.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p =
                 (_Bit_type *)0x300000008;
            tcu::TextureLevel::TextureLevel
                      ((TextureLevel *)&size,(TextureFormat *)&attachmentUsed,targetSize->m_data[0],
                       targetSize->m_data[1],1);
            pRVar39 = local_480;
            de::toString<unsigned_long>((string *)&origin,&local_488);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &format_3,"Attachment",(string *)&origin);
            de::toString<unsigned_long>(&local_458,&local_488);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&p,
                           "Attachment ",&local_458);
            pCVar37 = (ConstPixelBufferAccess *)&offset;
            tcu::LogImage::LogImage
                      ((LogImage *)&attachmentUsed,(string *)&format_3,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&p,
                       pCVar37,QP_IMAGE_COMPRESSION_MODE_BEST);
            tcu::LogImage::write
                      ((LogImage *)&attachmentUsed,(int)local_460,__buf_10,(size_t)pCVar37);
            tcu::LogImage::~LogImage((LogImage *)&attachmentUsed);
            std::__cxx11::string::~string((string *)&p);
            std::__cxx11::string::~string((string *)&local_458);
            std::__cxx11::string::~string((string *)&format_3);
            std::__cxx11::string::~string((string *)&origin);
            de::toString<unsigned_long>((string *)&p,&local_488);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &origin,"AttachmentReference",(string *)&p);
            de::toString<unsigned_long>(&local_378,&local_488);
            std::operator+(&local_458,"Attachment reference ",&local_378);
            pCVar37 = (ConstPixelBufferAccess *)&format_3;
            tcu::TextureLevel::getAccess
                      ((PixelBufferAccess *)pCVar37,
                       referenceAttachments.
                       super__Vector_base<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_>.
                       _M_impl.super__Vector_impl_data._M_start + local_488);
            tcu::LogImage::LogImage
                      ((LogImage *)&attachmentUsed,(string *)&origin,&local_458,pCVar37,
                       QP_IMAGE_COMPRESSION_MODE_BEST);
            tcu::LogImage::write
                      ((LogImage *)&attachmentUsed,(int)local_460,__buf_11,(size_t)pCVar37);
            tcu::LogImage::~LogImage((LogImage *)&attachmentUsed);
            std::__cxx11::string::~string((string *)&local_458);
            std::__cxx11::string::~string((string *)&local_378);
            std::__cxx11::string::~string((string *)&origin);
            std::__cxx11::string::~string((string *)&p);
            pAVar34 = (pRVar39->m_attachments).
                      super__Vector_base<vkt::(anonymous_namespace)::Attachment,_std::allocator<vkt::(anonymous_namespace)::Attachment>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            if ((pAVar34[local_488].m_storeOp == VK_ATTACHMENT_STORE_OP_STORE) ||
               (pAVar34[local_488].m_stencilStoreOp == VK_ATTACHMENT_STORE_OP_STORE)) {
              local_470 = referenceValues.
                          super__Vector_base<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>,_std::allocator<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + local_488;
              tcu::TextureLevel::getAccess
                        ((PixelBufferAccess *)&attachmentUsed,(TextureLevel *)&size);
              format_3.order = 0x3f800000;
              format_3.type = SNORM_INT8;
              origin.m_data[0] = 0.0;
              origin.m_data[1] = 1.0;
              bVar48 = true;
              for (iVar23 = 0; pRVar39 = local_480, iVar23 < (int)local_3f0[0]._4_4_;
                  iVar23 = iVar23 + 1) {
                for (iVar25 = 0; iVar25 < (int)local_3f0[0]._0_4_; iVar25 = iVar25 + 1) {
                  tcu::ConstPixelBufferAccess::getPixel
                            ((ConstPixelBufferAccess *)&p,(int)&offset,iVar25,iVar23);
                  iVar27 = (undefined4)local_3f0[0].m_align * iVar23;
                  pPVar4 = (local_470->
                           super__Vector_base<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
                           )._M_impl.super__Vector_impl_data._M_start;
                  bVar19 = true;
                  for (lVar44 = 0; lVar44 != 4; lVar44 = lVar44 + 1) {
                    PixelValue::getValue
                              ((PixelValue *)&local_458,(size_t)(pPVar4 + (iVar27 + iVar25)));
                    if (local_458._M_dataplus._M_p != (char *)0x0) {
                      fVar50 = p.m_data[lVar44];
                      if (*local_458._M_dataplus._M_p == '\x01') {
                        bVar49 = fVar50 == 1.0;
                      }
                      else {
                        bVar49 = fVar50 == 0.0;
                      }
                      if ((!bVar49) || (NAN(fVar50))) {
                        bVar19 = false;
                      }
                    }
                  }
                  color = &format_3;
                  if (bVar19) {
                    color = (TextureFormat *)&origin;
                  }
                  tcu::PixelBufferAccess::setPixel
                            ((PixelBufferAccess *)&attachmentUsed,(Vec4 *)color,iVar25,iVar23,0);
                  bVar48 = (bool)(bVar19 & bVar48);
                }
              }
              if (!bVar48) {
                de::toString<unsigned_long>((string *)&p,&local_488);
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &origin,"AttachmentError",(string *)&p);
                de::toString<unsigned_long>(&local_378,&local_488);
                std::operator+(&local_458,"Attachment Error ",&local_378);
                pCVar37 = (ConstPixelBufferAccess *)&format_3;
                tcu::TextureLevel::getAccess((PixelBufferAccess *)pCVar37,(TextureLevel *)&size);
                tcu::LogImage::LogImage
                          ((LogImage *)&attachmentUsed,(string *)&origin,&local_458,pCVar37,
                           QP_IMAGE_COMPRESSION_MODE_BEST);
                tcu::LogImage::write
                          ((LogImage *)&attachmentUsed,(int)local_460,__buf_12,(size_t)pCVar37);
                goto LAB_004427b3;
              }
            }
          }
        }
        pTVar38 = (TextureLevel *)&size;
      }
      tcu::TextureLevel::~TextureLevel(pTVar38);
    }
    local_488 = local_488 + 1;
    pAVar34 = (pRVar39->m_attachments).
              super__Vector_base<vkt::(anonymous_namespace)::Attachment,_std::allocator<vkt::(anonymous_namespace)::Attachment>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pAVar36 = (pRVar39->m_attachments).
              super__Vector_base<vkt::(anonymous_namespace)::Attachment,_std::allocator<vkt::(anonymous_namespace)::Attachment>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  } while( true );
}

Assistant:

bool logAndVerifyImages (TestLog&											log,
						 const DeviceInterface&								vk,
						 VkDevice											device,
						 const vector<de::SharedPtr<AttachmentResources> >&	attachmentResources,
						 const vector<bool>&								attachmentIsLazy,
						 const RenderPass&									renderPassInfo,
						 const vector<Maybe<VkClearValue> >&				renderPassClearValues,
						 const vector<Maybe<VkClearValue> >&				imageClearValues,
						 const vector<SubpassRenderInfo>&					subpassRenderInfo,
						 const UVec2&										targetSize,
						 const TestConfig&									config)
{
	vector<vector<PixelValue> >	referenceValues;
	vector<tcu::TextureLevel>	referenceAttachments;
	bool						isOk					= true;

	log << TestLog::Message << "Reference images fill undefined pixels with 3x3 grid pattern." << TestLog::EndMessage;

	renderReferenceValues(referenceValues, renderPassInfo, targetSize, imageClearValues, renderPassClearValues, subpassRenderInfo, config.renderPos, config.renderSize);
	renderReferenceImagesFromValues(referenceAttachments, referenceValues, targetSize, renderPassInfo);

	for (size_t attachmentNdx = 0; attachmentNdx < renderPassInfo.getAttachments().size(); attachmentNdx++)
	{
		if (!attachmentIsLazy[attachmentNdx])
		{
			const Attachment			attachment		= renderPassInfo.getAttachments()[attachmentNdx];
			const tcu::TextureFormat	format			= mapVkFormat(attachment.getFormat());

			if (tcu::hasDepthComponent(format.order) && tcu::hasStencilComponent(format.order))
			{
				const tcu::TextureFormat	depthFormat			= getDepthCopyFormat(attachment.getFormat());
				const VkDeviceSize			depthBufferSize		= targetSize.x() * targetSize.y() * depthFormat.getPixelSize();
				void* const					depthPtr			= attachmentResources[attachmentNdx]->getResultMemory().getHostPtr();

				const tcu::TextureFormat	stencilFormat		= getStencilCopyFormat(attachment.getFormat());
				const VkDeviceSize			stencilBufferSize	= targetSize.x() * targetSize.y() * stencilFormat.getPixelSize();
				void* const					stencilPtr			= attachmentResources[attachmentNdx]->getSecondaryResultMemory().getHostPtr();

				const VkMappedMemoryRange	ranges[]			=
				{
					{
						VK_STRUCTURE_TYPE_MAPPED_MEMORY_RANGE,								// sType;
						DE_NULL,															// pNext;
						attachmentResources[attachmentNdx]->getResultMemory().getMemory(),	// mem;
						attachmentResources[attachmentNdx]->getResultMemory().getOffset(),	// offset;
						depthBufferSize														// size;
					},
					{
						VK_STRUCTURE_TYPE_MAPPED_MEMORY_RANGE,										// sType;
						DE_NULL,																	// pNext;
						attachmentResources[attachmentNdx]->getSecondaryResultMemory().getMemory(),	// mem;
						attachmentResources[attachmentNdx]->getSecondaryResultMemory().getOffset(),	// offset;
						stencilBufferSize															// size;
					}
				};
				VK_CHECK(vk.invalidateMappedMemoryRanges(device, 2u, ranges));

				{
					const ConstPixelBufferAccess	depthAccess			(depthFormat, targetSize.x(), targetSize.y(), 1, depthPtr);
					const ConstPixelBufferAccess	stencilAccess		(stencilFormat, targetSize.x(), targetSize.y(), 1, stencilPtr);
					tcu::TextureLevel				depthErrorImage		(tcu::TextureFormat(tcu::TextureFormat::RGBA, tcu::TextureFormat::UNORM_INT8), targetSize.x(), targetSize.y());
					tcu::TextureLevel				stencilErrorImage	(tcu::TextureFormat(tcu::TextureFormat::RGBA, tcu::TextureFormat::UNORM_INT8), targetSize.x(), targetSize.y());

					log << TestLog::Image("Attachment" + de::toString(attachmentNdx) + "Depth", "Attachment " + de::toString(attachmentNdx) + " Depth", depthAccess);
					log << TestLog::Image("Attachment" + de::toString(attachmentNdx) + "Stencil", "Attachment " + de::toString(attachmentNdx) + " Stencil", stencilAccess);

					log << TestLog::Image("AttachmentReference" + de::toString(attachmentNdx), "Attachment reference " + de::toString(attachmentNdx), referenceAttachments[attachmentNdx].getAccess());

					if (renderPassInfo.getAttachments()[attachmentNdx].getStoreOp() == VK_ATTACHMENT_STORE_OP_STORE
						&& !verifyDepthAttachment(referenceValues[attachmentNdx], depthAccess, depthErrorImage.getAccess()))
					{
						log << TestLog::Image("DepthAttachmentError" + de::toString(attachmentNdx), "Depth Attachment Error " + de::toString(attachmentNdx), depthErrorImage.getAccess());
						isOk = false;
					}

					if (renderPassInfo.getAttachments()[attachmentNdx].getStencilStoreOp() == VK_ATTACHMENT_STORE_OP_STORE
						&& !verifyStencilAttachment(referenceValues[attachmentNdx], stencilAccess, stencilErrorImage.getAccess()))
					{
						log << TestLog::Image("StencilAttachmentError" + de::toString(attachmentNdx), "Stencil Attachment Error " + de::toString(attachmentNdx), stencilErrorImage.getAccess());
						isOk = false;
					}
				}
			}
			else
			{
				const VkDeviceSize			bufferSize	= targetSize.x() * targetSize.y() * format.getPixelSize();
				void* const					ptr			= attachmentResources[attachmentNdx]->getResultMemory().getHostPtr();

				const VkMappedMemoryRange	range		=
				{
					VK_STRUCTURE_TYPE_MAPPED_MEMORY_RANGE,								// sType;
					DE_NULL,															// pNext;
					attachmentResources[attachmentNdx]->getResultMemory().getMemory(),	// mem;
					attachmentResources[attachmentNdx]->getResultMemory().getOffset(),	// offset;
					bufferSize															// size;
				};
				VK_CHECK(vk.invalidateMappedMemoryRanges(device, 1u, &range));

				if (tcu::hasDepthComponent(format.order))
				{
					const ConstPixelBufferAccess	access		(format, targetSize.x(), targetSize.y(), 1, ptr);
					tcu::TextureLevel				errorImage	(tcu::TextureFormat(tcu::TextureFormat::RGBA, tcu::TextureFormat::UNORM_INT8), targetSize.x(), targetSize.y());

					log << TestLog::Image("Attachment" + de::toString(attachmentNdx), "Attachment " + de::toString(attachmentNdx), access);
					log << TestLog::Image("AttachmentReference" + de::toString(attachmentNdx), "Attachment reference " + de::toString(attachmentNdx), referenceAttachments[attachmentNdx].getAccess());

					if ((renderPassInfo.getAttachments()[attachmentNdx].getStoreOp() == VK_ATTACHMENT_STORE_OP_STORE || renderPassInfo.getAttachments()[attachmentNdx].getStencilStoreOp() == VK_ATTACHMENT_STORE_OP_STORE)
						&& !verifyDepthAttachment(referenceValues[attachmentNdx], access, errorImage.getAccess()))
					{
						log << TestLog::Image("AttachmentError" + de::toString(attachmentNdx), "Attachment Error " + de::toString(attachmentNdx), errorImage.getAccess());
						isOk = false;
					}
				}
				else if (tcu::hasStencilComponent(format.order))
				{
					const ConstPixelBufferAccess	access		(format, targetSize.x(), targetSize.y(), 1, ptr);
					tcu::TextureLevel				errorImage	(tcu::TextureFormat(tcu::TextureFormat::RGBA, tcu::TextureFormat::UNORM_INT8), targetSize.x(), targetSize.y());

					log << TestLog::Image("Attachment" + de::toString(attachmentNdx), "Attachment " + de::toString(attachmentNdx), access);
					log << TestLog::Image("AttachmentReference" + de::toString(attachmentNdx), "Attachment reference " + de::toString(attachmentNdx), referenceAttachments[attachmentNdx].getAccess());

					if ((renderPassInfo.getAttachments()[attachmentNdx].getStoreOp() == VK_ATTACHMENT_STORE_OP_STORE || renderPassInfo.getAttachments()[attachmentNdx].getStencilStoreOp() == VK_ATTACHMENT_STORE_OP_STORE)
						&& !verifyStencilAttachment(referenceValues[attachmentNdx], access, errorImage.getAccess()))
					{
						log << TestLog::Image("AttachmentError" + de::toString(attachmentNdx), "Attachment Error " + de::toString(attachmentNdx), errorImage.getAccess());
						isOk = false;
					}
				}
				else
				{
					const ConstPixelBufferAccess	access		(format, targetSize.x(), targetSize.y(), 1, ptr);
					tcu::TextureLevel				errorImage	(tcu::TextureFormat(tcu::TextureFormat::RGBA, tcu::TextureFormat::UNORM_INT8), targetSize.x(), targetSize.y());

					log << TestLog::Image("Attachment" + de::toString(attachmentNdx), "Attachment " + de::toString(attachmentNdx), access);
					log << TestLog::Image("AttachmentReference" + de::toString(attachmentNdx), "Attachment reference " + de::toString(attachmentNdx), referenceAttachments[attachmentNdx].getAccess());

					if ((renderPassInfo.getAttachments()[attachmentNdx].getStoreOp() == VK_ATTACHMENT_STORE_OP_STORE || renderPassInfo.getAttachments()[attachmentNdx].getStencilStoreOp() == VK_ATTACHMENT_STORE_OP_STORE)
						&& !verifyColorAttachment(referenceValues[attachmentNdx], access, errorImage.getAccess()))
					{
						log << TestLog::Image("AttachmentError" + de::toString(attachmentNdx), "Attachment Error " + de::toString(attachmentNdx), errorImage.getAccess());
						isOk = false;
					}
				}
			}
		}
	}

	return isOk;
}